

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-accept.c
# Opt level: O2

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  char *pcVar1;
  undefined8 uStack_20;
  
  if (tcp == (uv_stream_t *)0x0) {
    pcVar1 = "tcp != NULL";
    uStack_20 = 0x55;
LAB_00159b5b:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,uStack_20,pcVar1);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      pcVar1 = "nread == UV_EOF";
      uStack_20 = 0x5b;
      goto LAB_00159b5b;
    }
    puts("GOT EOF");
    uv_close((uv_handle_t *)tcp,close_cb);
  }
  else {
    bytes_received_done = bytes_received_done + nread;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  uv_loop_t* loop;
  unsigned int i;

  pending_incoming = (uv_tcp_t*) stream - &tcp_incoming[0];
  ASSERT(pending_incoming < got_connections);
  ASSERT(0 == uv_read_stop(stream));
  ASSERT(1 == nread);

  loop = stream->loop;
  read_cb_called++;

  /* Close all active incomings, except current one */
  for (i = 0; i < got_connections; i++) {
    if (i != pending_incoming)
      uv_close((uv_handle_t*) &tcp_incoming[i], close_cb);
  }

  /* Close server, so no one will connect to it */
  uv_close((uv_handle_t*) &tcp_server, close_cb);

  /* Create new fd that should be one of the closed incomings */
  ASSERT(0 == uv_tcp_init(loop, &tcp_check));
  ASSERT(0 == uv_tcp_connect(&tcp_check_req,
                             &tcp_check,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_read_start((uv_stream_t*) &tcp_check, alloc_cb, read_cb));
}